

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogText(char *fmt,...)

{
  ImGuiTextBuffer *this;
  int iVar1;
  ImGuiContext *pIVar2;
  char in_AL;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *__ptr;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  pIVar2 = GImGui;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (GImGui->LogEnabled == true) {
    args[0].reg_save_area = local_d8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 8;
    args[0].fp_offset = 0x30;
    this = &GImGui->LogBuffer;
    local_d0 = in_RSI;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    if (GImGui->LogFile == (ImFileHandle)0x0) {
      ImGuiTextBuffer::appendfv(this,fmt,args);
    }
    else {
      ImVector<char>::resize(&this->Buf,0);
      ImGuiTextBuffer::appendfv(this,fmt,args);
      __ptr = (pIVar2->LogBuffer).Buf.Data;
      if (__ptr == (char *)0x0) {
        __ptr = ImGuiTextBuffer::EmptyString;
      }
      iVar1 = (pIVar2->LogBuffer).Buf.Size;
      iVar3 = iVar1 + -1;
      if (iVar1 == 0) {
        iVar3 = 0;
      }
      fwrite(__ptr,1,(long)iVar3,(FILE *)pIVar2->LogFile);
    }
  }
  return;
}

Assistant:

void ImGui::LogText(const char* fmt, ...)
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    va_list args;
    va_start(args, fmt);
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
    va_end(args);
}